

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *pReader;
  Colour *pCVar1;
  _Head_base<0UL,_mkvparser::Projection_*,_false> _Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  longlong lVar6;
  VideoTrack *this;
  long lVar7;
  long stop;
  long unaff_R15;
  longlong pos;
  longlong size;
  char *colour_space;
  longlong id;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  double rate;
  long local_c8;
  longlong local_c0;
  Colour *local_b8;
  Colour *local_b0;
  long local_a8;
  _Head_base<0UL,_mkvparser::Projection_*,_false> local_a0;
  Colour *local_98;
  longlong local_90;
  longlong local_88;
  longlong local_80;
  longlong local_78;
  longlong local_70;
  longlong local_68;
  double local_60;
  VideoTrack **local_58;
  Info *local_50;
  Segment *local_48;
  longlong local_40;
  longlong local_38;
  
  lVar7 = -1;
  if ((*pResult == (VideoTrack *)0x0) && (info->type == 1)) {
    local_60 = 0.0;
    pReader = pSegment->m_pReader;
    local_c8 = (info->settings).start;
    stop = local_c8 + (info->settings).size;
    local_98 = (Colour *)0x0;
    local_b8 = (Colour *)0x0;
    local_a0._M_head_impl = (Projection *)0x0;
    local_68 = 0;
    local_70 = 0;
    local_78 = 0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    local_58 = pResult;
    local_50 = info;
    local_48 = pSegment;
    local_40 = element_start;
    local_38 = element_size;
    do {
      if (stop <= local_c8) {
        lVar7 = -2;
        if (local_c8 == stop) {
          this = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
          if (this == (VideoTrack *)0x0) {
            this = (VideoTrack *)0x0;
          }
          else {
            VideoTrack(this,local_48,local_40,local_38);
          }
          lVar7 = -1;
          if (this != (VideoTrack *)0x0) {
            iVar4 = Track::Info::Copy(local_50,&(this->super_Track).m_info);
            pCVar1 = local_98;
            _Var2._M_head_impl = local_a0._M_head_impl;
            if (iVar4 == 0) {
              this->m_width = local_90;
              this->m_height = local_88;
              this->m_display_width = local_80;
              this->m_display_height = local_78;
              this->m_display_unit = local_70;
              this->m_stereo_mode = local_68;
              this->m_rate = local_60;
              lVar7 = 0;
              local_98 = (Colour *)0x0;
              this->m_colour = pCVar1;
              this->m_colour_space = (char *)local_b8;
              local_a0._M_head_impl = (Projection *)0x0;
              this->m_projection = _Var2._M_head_impl;
              *local_58 = this;
              local_b8 = (Colour *)0x0;
            }
            else {
              (*(this->super_Track)._vptr_Track[1])(this);
            }
          }
        }
        break;
      }
      lVar7 = ParseElementHeader(pReader,&local_c8,stop,&local_a8,&local_c0);
      if (lVar7 < 0) {
LAB_0015d215:
        bVar3 = false;
      }
      else {
        lVar7 = unaff_R15;
        if (local_a8 < 0x54ba) {
          if (local_a8 < 0x53b8) {
            if (local_a8 == 0xb0) {
              local_90 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_90;
            }
            else {
              if (local_a8 != 0xba) goto LAB_0015d26e;
              local_88 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_88;
            }
joined_r0x0015d14c:
            if (lVar6 < 1) {
LAB_0015d20e:
              lVar7 = -2;
              goto LAB_0015d215;
            }
          }
          else {
            if (local_a8 == 0x53b8) {
              local_68 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_68;
            }
            else {
              if (local_a8 == 0x54b0) {
                local_80 = UnserializeUInt(pReader,local_c8,local_c0);
                lVar6 = local_80;
                goto joined_r0x0015d14c;
              }
              if (local_a8 != 0x54b2) goto LAB_0015d26e;
              local_70 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_70;
            }
            if (lVar6 < 0) goto LAB_0015d20e;
          }
        }
        else {
          if (local_a8 < 0x7670) {
            if (local_a8 == 0x54ba) {
              local_78 = UnserializeUInt(pReader,local_c8,local_c0);
              lVar6 = local_78;
              goto joined_r0x0015d14c;
            }
            if (local_a8 != 0x55b0) goto LAB_0015d26e;
            local_b0 = (Colour *)0x0;
            bVar3 = Colour::Parse(pReader,local_c8,local_c0,&local_b0);
            pCVar1 = local_98;
            lVar7 = -2;
            if ((bVar3) && (local_98 = local_b0, lVar7 = unaff_R15, pCVar1 != (Colour *)0x0)) {
              Colour::~Colour(pCVar1);
              operator_delete(pCVar1);
            }
          }
          else {
            if (local_a8 != 0x7670) {
              if (local_a8 == 0x2383e3) {
                lVar5 = UnserializeFloat(pReader,local_c8,local_c0,&local_60);
                if (local_60 <= 0.0) {
                  unaff_R15 = -2;
                }
                lVar7 = unaff_R15;
                if (lVar5 < 0) {
                  lVar7 = lVar5;
                }
                if (lVar5 < 0 || local_60 <= 0.0) goto LAB_0015d215;
              }
              else if (local_a8 == 0x2eb524) {
                local_b0 = (Colour *)0x0;
                lVar5 = UnserializeString(pReader,local_c8,local_c0,(char **)&local_b0);
                pCVar1 = local_b0;
                lVar7 = lVar5;
                if (-1 < lVar5) {
                  if (local_b8 != (Colour *)0x0) {
                    operator_delete__(local_b8);
                  }
                  local_b8 = pCVar1;
                  lVar7 = unaff_R15;
                }
                if (lVar5 < 0) {
                  bVar3 = false;
                  goto LAB_0015d28f;
                }
              }
              goto LAB_0015d26e;
            }
            local_b0 = (Colour *)0x0;
            bVar3 = Projection::Parse(pReader,local_c8,local_c0,(Projection **)&local_b0);
            lVar7 = -2;
            if (bVar3) {
              std::
              __uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::
              reset((__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     *)&local_a0,(pointer)local_b0);
              lVar7 = unaff_R15;
            }
          }
          if (bVar3 == false) {
            bVar3 = false;
            goto LAB_0015d28f;
          }
        }
LAB_0015d26e:
        local_c8 = local_c8 + local_c0;
        bVar3 = local_c8 <= stop;
        if (stop < local_c8) {
          lVar7 = -2;
        }
      }
LAB_0015d28f:
      unaff_R15 = lVar7;
    } while (bVar3);
    _Var2._M_head_impl = local_a0._M_head_impl;
    if (local_a0._M_head_impl != (Projection *)0x0) {
      if ((local_a0._M_head_impl)->private_data != (uchar *)0x0) {
        operator_delete__((local_a0._M_head_impl)->private_data);
      }
      operator_delete(_Var2._M_head_impl);
    }
    pCVar1 = local_98;
    if (local_98 != (Colour *)0x0) {
      Colour::~Colour(local_98);
      operator_delete(pCVar1);
    }
    if (local_b8 != (Colour *)0x0) {
      operator_delete__(local_b8);
    }
  }
  return lVar7;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  std::unique_ptr<char[]> colour_space_ptr;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      char* colour_space = NULL;
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
      colour_space_ptr.reset(colour_space);
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space_ptr.release();
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}